

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

void __thiscall
glcts::ExtensionDirectiveTestCaseGroup::ExtensionDirectiveTestCase::ExtensionDirectiveTestCase
          (ExtensionDirectiveTestCase *this,Context *context,GLSLVersion glslVersion,char *behaviour
          )

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  string b;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char *behaviour_local;
  Context *pCStack_18;
  GLSLVersion glslVersion_local;
  Context *context_local;
  ExtensionDirectiveTestCase *this_local;
  
  local_28 = behaviour;
  behaviour_local._4_4_ = glslVersion;
  pCStack_18 = context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"extension_directive_",&local_69);
  std::operator+(&local_48,&local_68,local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  deqp::TestCase::TestCase(&this->super_TestCase,context,pcVar2,"Test #extension directive.");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pcVar2 = local_28;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ExtensionDirectiveTestCase_03274670;
  this->m_glslVersion = behaviour_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_behaviourStr,pcVar2,
             (allocator<char> *)(b.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(b.field_2._M_local_buf + 0xb));
  pcVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,pcVar2,&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,"disable");
  if (bVar1) {
    this->m_requireInfoLog = true;
    this->m_requireCompile = false;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"enable");
    if (bVar1) {
      this->m_requireInfoLog = false;
      this->m_requireCompile = true;
    }
    else {
      this->m_requireInfoLog = false;
      this->m_requireCompile = true;
    }
  }
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

ExtensionDirectiveTestCase(deqp::Context& context, glu::GLSLVersion glslVersion, const char* behaviour)
			: TestCase(context, (std::string("extension_directive_") + behaviour).c_str(), "Test #extension directive.")
			, m_glslVersion(glslVersion)
			, m_behaviourStr(behaviour)
		{
			// Initialize expected compiler behaviour.
			std::string b(behaviour);
			if (b == "disable")
			{
				m_requireInfoLog = true;
				m_requireCompile = false;
			}
			else if (b == "enable")
			{
				m_requireInfoLog = false;
				m_requireCompile = true;
			}
			else
			{
				DE_ASSERT(b == "warn");
				m_requireInfoLog = false;
				m_requireCompile = true;
			}
		}